

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O1

uint __thiscall CaDiCaL::heap<CaDiCaL::elim_more>::pop_front(heap<CaDiCaL::elim_more> *this)

{
  uint a;
  uint b;
  uint *puVar1;
  pointer puVar2;
  ulong uVar3;
  
  puVar1 = (this->array).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->array).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  a = *puVar1;
  uVar3 = (ulong)a;
  b = puVar2[-1];
  if (4 < (ulong)((long)puVar2 - (long)puVar1)) {
    exchange(this,a,b);
  }
  if ((ulong)((long)(this->pos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->pos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar3) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->pos,uVar3 + 1,&invalid_heap_position);
  }
  (this->pos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[uVar3] = 0xffffffff;
  puVar2 = (this->array).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
  (this->array).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar2;
  if (4 < (ulong)((long)puVar2 -
                 (long)(this->array).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_start)) {
    down(this,b);
  }
  return a;
}

Assistant:

unsigned pop_front () {
    assert (!empty ());
    unsigned res = array[0], last = array.back ();
    if (size () > 1)
      exchange (res, last);
    index (res) = invalid_heap_position;
    array.pop_back ();
    if (size () > 1)
      down (last);
    check ();
    return res;
  }